

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

void __thiscall
ipx::Iterate::Update
          (Iterate *this,double sp,double *dx,double *dxl,double *dxu,double sd,double *dy,
          double *dzl,double *dzu)

{
  double dVar1;
  bool bVar2;
  Int IVar3;
  Int IVar4;
  State SVar5;
  double *pdVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  Iterate *in_XMM1_Qa;
  long in_stack_00000008;
  Int j_4;
  Int j_3;
  Int i;
  Int j_2;
  Int j_1;
  Int j;
  Int n;
  Int m;
  Iterate *in_stack_ffffffffffffff18;
  Iterate *in_stack_ffffffffffffff20;
  Iterate *in_stack_ffffffffffffff40;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  
  IVar3 = Model::rows((Model *)*in_RDI);
  IVar4 = Model::cols((Model *)*in_RDI);
  if (in_RSI != 0) {
    for (local_4c = 0; local_4c < IVar4 + IVar3; local_4c = local_4c + 1) {
      SVar5 = StateOf(in_stack_ffffffffffffff18,0);
      if (SVar5 != fixed) {
        dVar1 = *(double *)(in_RSI + (long)local_4c * 8);
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_4c);
        *pdVar6 = in_XMM0_Qa * dVar1 + *pdVar6;
      }
    }
  }
  if (in_RDX != 0) {
    for (local_50 = 0; local_50 < IVar4 + IVar3; local_50 = local_50 + 1) {
      bVar2 = has_barrier_lb(in_stack_ffffffffffffff20,
                             (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      if (bVar2) {
        dVar1 = *(double *)(in_RDX + (long)local_50 * 8);
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_50);
        *pdVar6 = in_XMM0_Qa * dVar1 + *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_50);
        pdVar6 = std::max<double>(pdVar6,(double *)&kBarrierMin);
        dVar1 = *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_50);
        *pdVar6 = dVar1;
      }
    }
  }
  if (in_RCX != 0) {
    for (local_54 = 0; local_54 < IVar4 + IVar3; local_54 = local_54 + 1) {
      bVar2 = has_barrier_ub(in_stack_ffffffffffffff20,
                             (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      if (bVar2) {
        dVar1 = *(double *)(in_RCX + (long)local_54 * 8);
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_54);
        *pdVar6 = in_XMM0_Qa * dVar1 + *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_54);
        pdVar6 = std::max<double>(pdVar6,(double *)&kBarrierMin);
        dVar1 = *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_54);
        *pdVar6 = dVar1;
      }
    }
  }
  if (in_R8 != 0) {
    for (local_58 = 0; local_58 < IVar3; local_58 = local_58 + 1) {
      dVar1 = *(double *)(in_R8 + (long)local_58 * 8);
      pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 7),(long)local_58);
      *pdVar6 = (double)in_XMM1_Qa * dVar1 + *pdVar6;
    }
  }
  if (in_R9 != 0) {
    for (local_5c = 0; local_5c < IVar4 + IVar3; local_5c = local_5c + 1) {
      bVar2 = has_barrier_lb(in_stack_ffffffffffffff20,
                             (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      if (bVar2) {
        dVar1 = *(double *)(in_R9 + (long)local_5c * 8);
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_5c);
        *pdVar6 = (double)in_XMM1_Qa * dVar1 + *pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_5c);
        pdVar6 = std::max<double>(pdVar6,(double *)&kBarrierMin);
        in_stack_ffffffffffffff40 = (Iterate *)*pdVar6;
        pdVar6 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_5c);
        *pdVar6 = (double)in_stack_ffffffffffffff40;
      }
    }
  }
  if (in_stack_00000008 != 0) {
    for (local_60 = 0; local_60 < IVar4 + IVar3; local_60 = local_60 + 1) {
      bVar2 = has_barrier_ub(in_stack_ffffffffffffff20,
                             (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      if (bVar2) {
        in_stack_ffffffffffffff20 = *(Iterate **)(in_stack_00000008 + (long)local_60 * 8);
        in_stack_ffffffffffffff18 = in_XMM1_Qa;
        pdVar6 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_60);
        *pdVar6 = (double)in_stack_ffffffffffffff18 * (double)in_stack_ffffffffffffff20 + *pdVar6;
        pdVar6 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_60);
        pdVar6 = std::max<double>(pdVar6,(double *)&kBarrierMin);
        dVar1 = *pdVar6;
        pdVar6 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_60);
        *pdVar6 = dVar1;
      }
    }
  }
  assert_consistency(in_stack_ffffffffffffff40);
  *(undefined1 *)(in_RDI + 0x21) = 0;
  return;
}

Assistant:

void Iterate::Update(double sp, const double* dx, const double* dxl,
                     const double* dxu, double sd, const double* dy,
                     const double* dzl, const double* dzu) {
    const Int m = model_.rows();
    const Int n = model_.cols();

    if (dx) {
        for (Int j = 0; j < n+m; j++)
            if (StateOf(j) != State::fixed)
                x_[j] += sp*dx[j];
    }
    if (dxl) {
        for (Int j = 0; j < n+m; j++)
            if (has_barrier_lb(j)) {
                xl_[j] += sp*dxl[j];
                xl_[j] = std::max(xl_[j], kBarrierMin);
            }
    }
    if (dxu) {
        for (Int j = 0; j < n+m; j++)
            if (has_barrier_ub(j)) {
                xu_[j] += sp*dxu[j];
                xu_[j] = std::max(xu_[j], kBarrierMin);
            }
    }
    if (dy) {
        for (Int i = 0; i < m; i++)
            y_[i] += sd*dy[i];
    }
    if (dzl) {
        for (Int j = 0; j < n+m; j++)
            if (has_barrier_lb(j)) {
                zl_[j] += sd*dzl[j];
                zl_[j] = std::max(zl_[j], kBarrierMin);
            }
    }
    if (dzu) {
        for (Int j = 0; j < n+m; j++)
            if (has_barrier_ub(j)) {
                zu_[j] += sd*dzu[j];
                zu_[j] = std::max(zu_[j], kBarrierMin);
            }
    }
    assert_consistency();
    evaluated_ = false;
}